

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O1

bool cmHexFileConverter::TryConvert(char *inFileName,char *outFileName)

{
  undefined1 *puVar1;
  bool bVar2;
  FileType FVar3;
  uint uVar4;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar5;
  uint startIndex;
  bool bVar6;
  char buf [1024];
  allocator local_439;
  string local_438 [32];
  
  FVar3 = DetermineFileType(inFileName);
  if (FVar3 != Binary) {
    std::__cxx11::string::string((string *)local_438,inFileName,&local_439);
    __stream = (FILE *)cmsys::SystemTools::Fopen(local_438,"rb");
    puVar1 = (undefined1 *)
             CONCAT17(local_438[0]._M_dataplus._M_p._7_1_,
                      CONCAT52(local_438[0]._M_dataplus._M_p._2_5_,
                               CONCAT11(local_438[0]._M_dataplus._M_p._1_1_,
                                        (char)local_438[0]._M_dataplus._M_p)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar1 != &local_438[0].field_2) {
      operator_delete(puVar1,local_438[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string((string *)local_438,outFileName,&local_439);
    __stream_00 = (FILE *)cmsys::SystemTools::Fopen(local_438,"wb");
    puVar1 = (undefined1 *)
             CONCAT17(local_438[0]._M_dataplus._M_p._7_1_,
                      CONCAT52(local_438[0]._M_dataplus._M_p._2_5_,
                               CONCAT11(local_438[0]._M_dataplus._M_p._1_1_,
                                        (char)local_438[0]._M_dataplus._M_p)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar1 != &local_438[0].field_2) {
      operator_delete(puVar1,local_438[0].field_2._M_allocated_capacity + 1);
    }
    if (__stream != (FILE *)0x0 && __stream_00 != (FILE *)0x0) {
      pcVar5 = fgets((char *)local_438,0x400,__stream);
      if (pcVar5 == (char *)0x0) {
        bVar2 = false;
      }
      else {
        do {
          uVar4 = ChompStrlen((char *)local_438);
          if (FVar3 == MotorolaSrec) {
            if (((uVar4 & 1) == 0 && uVar4 - 10 < 0x205) &&
                (char)local_438[0]._M_dataplus._M_p == 'S') {
              bVar2 = true;
              switch(local_438[0]._M_dataplus._M_p._1_1_) {
              case 0x31:
                startIndex = 8;
                break;
              case 0x32:
                startIndex = 10;
                break;
              case 0x33:
                startIndex = 0xc;
                break;
              default:
                goto switchD_003e1a80_caseD_34;
              case 0x35:
              case 0x37:
              case 0x38:
              case 0x39:
                goto switchD_003e1a80_caseD_35;
              }
LAB_003e1aea:
              bVar2 = OutputBin((FILE *)__stream_00,(char *)local_438,startIndex,uVar4 - 2);
            }
            else {
switchD_003e1a80_caseD_34:
              bVar2 = false;
            }
          }
          else {
            bVar6 = false;
            bVar2 = false;
            if ((((uVar4 - 0xb < 0x201) && (bVar2 = bVar6, (uVar4 & 1) != 0)) &&
                ((char)local_438[0]._M_dataplus._M_p == ':')) &&
               ((local_438[0]._M_dataplus._M_p._7_1_ == '0' &&
                (bVar2 = true, 3 < (byte)local_438[0]._M_string_length - 0x32)))) {
              if ((byte)local_438[0]._M_string_length - 0x30 < 2) {
                startIndex = 9;
                goto LAB_003e1aea;
              }
              goto switchD_003e1a80_caseD_34;
            }
          }
switchD_003e1a80_caseD_35:
        } while ((bVar2 != false) &&
                (pcVar5 = fgets((char *)local_438,0x400,__stream), pcVar5 != (char *)0x0));
      }
      fclose(__stream);
      fclose(__stream_00);
      return bVar2;
    }
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    if (__stream_00 != (FILE *)0x0) {
      fclose(__stream_00);
    }
  }
  return false;
}

Assistant:

bool cmHexFileConverter::TryConvert(const char* inFileName,
                                    const char* outFileName)
{
  FileType type = DetermineFileType(inFileName);
  if (type == Binary)
    {
    return false;
    }

  // try to open the file
  FILE* inFile = cmsys::SystemTools::Fopen(inFileName, "rb");
  FILE* outFile = cmsys::SystemTools::Fopen(outFileName, "wb");
  if ((inFile == 0) || (outFile == 0))
    {
    if (inFile != 0)
      {
      fclose(inFile);
      }
    if (outFile != 0)
      {
      fclose(outFile);
      }
    return false;
    }

  // convert them line by line
  bool success = false;
  char buf[1024];
  while (fgets(buf, 1024, inFile) != 0)
    {
    if (type == MotorolaSrec)
      {
      success = ConvertMotorolaSrecLine(buf, outFile);
      }
    else if (type == IntelHex)
      {
      success = ConvertIntelHexLine(buf, outFile);
      }
    if (success == false)
      {
      break;
      }
    }

  // close them again
  fclose(inFile);
  fclose(outFile);
  return success;
}